

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

void RegexTree::display_node(tree_node *ptr,ostream *os)

{
  char cVar1;
  ostream *poVar2;
  char toshow;
  ostream *os_local;
  tree_node *ptr_local;
  
  if (ptr != (tree_node *)0x0) {
    if ((ptr->left == (tree_node *)0x0) && (ptr->right == (tree_node *)0x0)) {
      cVar1 = show_control(ptr->c);
      std::operator<<(os,cVar1);
    }
    else {
      cVar1 = show_control(ptr->c);
      poVar2 = std::operator<<(os,cVar1);
      std::operator<<(poVar2,"(");
      display_node(ptr->left,os);
      std::operator<<(os,", ");
      display_node(ptr->right,os);
      std::operator<<(os,")");
    }
  }
  return;
}

Assistant:

void RegexTree::display_node(const tree_node *ptr, std::ostream &os) {
    if (ptr == nullptr)
        return;
    else if (ptr->left == nullptr && ptr->right == nullptr) {
        os << show_control(ptr->c);
        return;
    }

    char toshow = show_control(ptr->c);
    os << toshow << "(";
    display_node(ptr->left, os);
    os << ", ";
    display_node(ptr->right, os);
    os << ")";
}